

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

ON_StringMapOrdinalType ON_StringMapOrdinalTypeFromStringMapType(ON_StringMapType map_type)

{
  undefined4 local_c;
  ON_StringMapType map_type_local;
  
  if (map_type == Identity) {
    local_c = Identity;
  }
  else if (map_type == UpperCase) {
    local_c = UpperOrdinal;
  }
  else if (map_type == LowerCase) {
    local_c = LowerOrdinal;
  }
  else {
    local_c = Identity;
  }
  return local_c;
}

Assistant:

ON_StringMapOrdinalType ON_StringMapOrdinalTypeFromStringMapType(
  ON_StringMapType map_type
  )
{
  switch (map_type)
  {
  case ON_StringMapType::UpperCase:
    return ON_StringMapOrdinalType::UpperOrdinal;
  case ON_StringMapType::LowerCase:
    return ON_StringMapOrdinalType::LowerOrdinal;
  case ON_StringMapType::Identity:
    return ON_StringMapOrdinalType::Identity;
  }
  return ON_StringMapOrdinalType::Identity;
}